

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

CURLcode dict_do(Curl_easy *data,_Bool *done)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  CURLcode CVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *__s;
  char *pcVar7;
  char *path;
  char *local_30;
  
  *done = true;
  CVar3 = Curl_urldecode((data->state).up.path,0,&local_30,(size_t *)0x0,REJECT_CTRL);
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  iVar4 = curl_strnequal(local_30,"/MATCH:",7);
  if (((iVar4 == 0) && (iVar4 = curl_strnequal(local_30,"/M:",3), iVar4 == 0)) &&
     (iVar4 = curl_strnequal(local_30,"/FIND:",6), iVar4 == 0)) {
    iVar4 = curl_strnequal(local_30,"/DEFINE:",8);
    if (((iVar4 == 0) && (iVar4 = curl_strnequal(local_30,"/D:",3), iVar4 == 0)) &&
       (iVar4 = curl_strnequal(local_30,"/LOOKUP:",8), iVar4 == 0)) {
      pcVar5 = strchr(local_30,0x2f);
      if (pcVar5 != (char *)0x0) {
        pcVar6 = pcVar5 + 1;
        do {
          if (*pcVar6 == ':') {
            *pcVar6 = ' ';
          }
          else if (*pcVar6 == '\0') goto LAB_001231dd;
          pcVar6 = pcVar6 + 1;
        } while( true );
      }
      pcVar5 = (char *)0x0;
      CVar3 = CURLE_OK;
      goto LAB_0012322d;
    }
    pcVar5 = strchr(local_30,0x3a);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
LAB_0012311a:
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar5 = pcVar5 + 1;
      pcVar6 = strchr(pcVar5,0x3a);
      if (pcVar6 == (char *)0x0) goto LAB_0012311a;
      pcVar7 = pcVar6 + 1;
      *pcVar6 = '\0';
      pcVar6 = strchr(pcVar7,0x3a);
      if (pcVar6 != (char *)0x0) {
        *pcVar6 = '\0';
      }
    }
    if ((((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) &&
        ((pcVar5 = "default", data != (Curl_easy *)0x0 && (((data->set).field_0x8cd & 0x10) != 0))))
       && ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))
       ) {
      Curl_infof(data,"lookup word is missing");
    }
    if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
      pcVar7 = "!";
    }
    pcVar5 = unescape_word(pcVar5);
    if (pcVar5 == (char *)0x0) goto LAB_001231a0;
    CVar3 = sendf(data,"CLIENT libcurl 8.11.0-DEV\r\nDEFINE %s %s\r\nQUIT\r\n",pcVar7);
  }
  else {
    pcVar5 = strchr(local_30,0x3a);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
LAB_00122fb7:
      pcVar7 = (char *)0x0;
LAB_00122fba:
      __s = (char *)0x0;
    }
    else {
      pcVar5 = pcVar5 + 1;
      pcVar6 = strchr(pcVar5,0x3a);
      if (pcVar6 == (char *)0x0) goto LAB_00122fb7;
      pcVar7 = pcVar6 + 1;
      *pcVar6 = '\0';
      pcVar6 = strchr(pcVar7,0x3a);
      if (pcVar6 == (char *)0x0) goto LAB_00122fba;
      __s = pcVar6 + 1;
      *pcVar6 = '\0';
      pcVar6 = strchr(__s,0x3a);
      if (pcVar6 != (char *)0x0) {
        *pcVar6 = '\0';
      }
    }
    if ((((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) &&
        ((pcVar5 = "default", data != (Curl_easy *)0x0 && (((data->set).field_0x8cd & 0x10) != 0))))
       && ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))
       ) {
      Curl_infof(data,"lookup word is missing");
    }
    if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
      pcVar7 = "!";
    }
    if ((__s == (char *)0x0) || (*__s == '\0')) {
      __s = ".";
    }
    pcVar5 = unescape_word(pcVar5);
    if (pcVar5 == (char *)0x0) {
LAB_001231a0:
      CVar3 = CURLE_OUT_OF_MEMORY;
      pcVar5 = (char *)0x0;
      goto LAB_0012322d;
    }
    CVar3 = sendf(data,"CLIENT libcurl 8.11.0-DEV\r\nMATCH %s %s %s\r\nQUIT\r\n",pcVar7,__s,pcVar5);
  }
  CVar2 = CURLE_OK;
  if (CVar3 != CURLE_OK) {
    Curl_failf(data,"Failed sending DICT request");
    goto LAB_0012322d;
  }
LAB_00123217:
  CVar3 = CVar2;
  Curl_xfer_setup1(data,1,-1,false);
LAB_0012322d:
  (*Curl_cfree)(pcVar5);
  (*Curl_cfree)(local_30);
  return CVar3;
LAB_001231dd:
  CVar3 = sendf(data,"CLIENT libcurl 8.11.0-DEV\r\n%s\r\nQUIT\r\n",pcVar5 + 1);
  if (CVar3 != CURLE_OK) {
    pcVar5 = (char *)0x0;
    Curl_failf(data,"Failed sending DICT request");
    goto LAB_0012322d;
  }
  pcVar5 = (char *)0x0;
  CVar2 = CVar3;
  goto LAB_00123217;
}

Assistant:

static CURLcode dict_do(struct Curl_easy *data, bool *done)
{
  char *word;
  char *eword = NULL;
  char *ppath;
  char *database = NULL;
  char *strategy = NULL;
  char *nthdef = NULL; /* This is not part of the protocol, but required
                          by RFC 2229 */
  CURLcode result;

  char *path;

  *done = TRUE; /* unconditionally */

  /* url-decode path before further evaluation */
  result = Curl_urldecode(data->state.up.path, 0, &path, NULL, REJECT_CTRL);
  if(result)
    return result;

  if(strncasecompare(path, DICT_MATCH, sizeof(DICT_MATCH)-1) ||
     strncasecompare(path, DICT_MATCH2, sizeof(DICT_MATCH2)-1) ||
     strncasecompare(path, DICT_MATCH3, sizeof(DICT_MATCH3)-1)) {

    word = strchr(path, ':');
    if(word) {
      word++;
      database = strchr(word, ':');
      if(database) {
        *database++ = (char)0;
        strategy = strchr(database, ':');
        if(strategy) {
          *strategy++ = (char)0;
          nthdef = strchr(strategy, ':');
          if(nthdef) {
            *nthdef = (char)0;
          }
        }
      }
    }

    if(!word || (*word == (char)0)) {
      infof(data, "lookup word is missing");
      word = (char *)"default";
    }
    if(!database || (*database == (char)0)) {
      database = (char *)"!";
    }
    if(!strategy || (*strategy == (char)0)) {
      strategy = (char *)".";
    }

    eword = unescape_word(word);
    if(!eword) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    result = sendf(data,
                   "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                   "MATCH "
                   "%s "    /* database */
                   "%s "    /* strategy */
                   "%s\r\n" /* word */
                   "QUIT\r\n",
                   database,
                   strategy,
                   eword);

    if(result) {
      failf(data, "Failed sending DICT request");
      goto error;
    }
    Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE); /* no upload */
  }
  else if(strncasecompare(path, DICT_DEFINE, sizeof(DICT_DEFINE)-1) ||
          strncasecompare(path, DICT_DEFINE2, sizeof(DICT_DEFINE2)-1) ||
          strncasecompare(path, DICT_DEFINE3, sizeof(DICT_DEFINE3)-1)) {

    word = strchr(path, ':');
    if(word) {
      word++;
      database = strchr(word, ':');
      if(database) {
        *database++ = (char)0;
        nthdef = strchr(database, ':');
        if(nthdef) {
          *nthdef = (char)0;
        }
      }
    }

    if(!word || (*word == (char)0)) {
      infof(data, "lookup word is missing");
      word = (char *)"default";
    }
    if(!database || (*database == (char)0)) {
      database = (char *)"!";
    }

    eword = unescape_word(word);
    if(!eword) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    result = sendf(data,
                   "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                   "DEFINE "
                   "%s "     /* database */
                   "%s\r\n"  /* word */
                   "QUIT\r\n",
                   database,
                   eword);

    if(result) {
      failf(data, "Failed sending DICT request");
      goto error;
    }
    Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE);
  }
  else {

    ppath = strchr(path, '/');
    if(ppath) {
      int i;

      ppath++;
      for(i = 0; ppath[i]; i++) {
        if(ppath[i] == ':')
          ppath[i] = ' ';
      }
      result = sendf(data,
                     "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                     "%s\r\n"
                     "QUIT\r\n", ppath);
      if(result) {
        failf(data, "Failed sending DICT request");
        goto error;
      }

      Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE);
    }
  }

error:
  free(eword);
  free(path);
  return result;
}